

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xpath_string * pugi::impl::anon_unknown_0::string_value(xpath_node *na,xpath_allocator *alloc)

{
  bool bVar1;
  xml_node_type xVar2;
  xml_node_type xVar3;
  unspecified_bool_type p_Var4;
  char_t *pcVar5;
  unspecified_bool_type p_Var6;
  xpath_node *in_RSI;
  xpath_string *in_RDI;
  xpath_string *result;
  xml_node cur;
  xml_node n;
  xpath_node *in_stack_ffffffffffffff48;
  undefined2 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff52;
  undefined1 in_stack_ffffffffffffff53;
  undefined1 uVar7;
  undefined4 in_stack_ffffffffffffff54;
  xml_node local_88;
  xml_node in_stack_ffffffffffffff80;
  xml_node in_stack_ffffffffffffff88;
  xml_node in_stack_ffffffffffffff90;
  xml_node local_68 [4];
  xml_node local_48 [4];
  xml_node local_28;
  xml_attribute local_20;
  xml_attribute local_18 [2];
  xpath_node *local_8;
  
  local_8 = in_RSI;
  local_18[0] = xpath_node::attribute(in_RSI);
  p_Var4 = xml_attribute::operator_cast_to_function_pointer(local_18);
  if (p_Var4 == (unspecified_bool_type)0x0) {
    local_28 = xpath_node::node(in_stack_ffffffffffffff48);
    xVar2 = xml_node::type(&local_28);
    if (xVar2 - node_document < 2) {
      xpath_string::xpath_string(in_RDI);
      pcVar5 = xml_node::value(&local_28);
      if (*pcVar5 != '\0') {
        xml_node::value(&local_28);
        xpath_string::from_const
                  ((char_t *)
                   CONCAT44(xVar2,CONCAT13(in_stack_ffffffffffffff53,
                                           CONCAT12(in_stack_ffffffffffffff52,
                                                    in_stack_ffffffffffffff50))));
        xpath_string::append
                  ((xpath_string *)in_stack_ffffffffffffff90._root,
                   (xpath_string *)in_stack_ffffffffffffff88._root,
                   (xpath_allocator *)in_stack_ffffffffffffff80._root);
      }
      local_48[0] = xml_node::first_child(&in_stack_ffffffffffffff48->_node);
      while( true ) {
        p_Var6 = xml_node::operator_cast_to_function_pointer(local_48);
        uVar7 = false;
        if (p_Var6 != (unspecified_bool_type)0x0) {
          uVar7 = xml_node::operator!=(local_48,&local_28);
        }
        if ((bool)uVar7 == false) break;
        xVar3 = xml_node::type(local_48);
        if ((xVar3 == node_pcdata) || (xVar3 = xml_node::type(local_48), xVar3 == node_cdata)) {
          xml_node::value(local_48);
          xpath_string::from_const
                    ((char_t *)
                     CONCAT44(xVar2,CONCAT13(uVar7,CONCAT12(in_stack_ffffffffffffff52,
                                                            in_stack_ffffffffffffff50))));
          xpath_string::append
                    ((xpath_string *)in_stack_ffffffffffffff90._root,
                     (xpath_string *)in_stack_ffffffffffffff88._root,
                     (xpath_allocator *)in_stack_ffffffffffffff80._root);
        }
        local_68[0] = xml_node::first_child(&in_stack_ffffffffffffff48->_node);
        p_Var6 = xml_node::operator_cast_to_function_pointer(local_68);
        if (p_Var6 == (unspecified_bool_type)0x0) {
          in_stack_ffffffffffffff88 = xml_node::next_sibling(&in_stack_ffffffffffffff48->_node);
          p_Var6 = xml_node::operator_cast_to_function_pointer((xml_node *)&stack0xffffffffffffff88)
          ;
          if (p_Var6 == (unspecified_bool_type)0x0) {
            while( true ) {
              local_88 = xml_node::next_sibling(&in_stack_ffffffffffffff48->_node);
              bVar1 = xml_node::operator!(&local_88);
              in_stack_ffffffffffffff52 = false;
              if (bVar1) {
                in_stack_ffffffffffffff52 = xml_node::operator!=(local_48,&local_28);
              }
              if ((bool)in_stack_ffffffffffffff52 == false) break;
              local_48[0] = xml_node::parent(&in_stack_ffffffffffffff48->_node);
            }
            bVar1 = xml_node::operator!=(local_48,&local_28);
            if (bVar1) {
              local_48[0] = xml_node::next_sibling(&in_stack_ffffffffffffff48->_node);
            }
          }
          else {
            in_stack_ffffffffffffff80 = xml_node::next_sibling(&in_stack_ffffffffffffff48->_node);
            local_48[0] = in_stack_ffffffffffffff80;
          }
        }
        else {
          in_stack_ffffffffffffff90 = xml_node::first_child(&in_stack_ffffffffffffff48->_node);
          local_48[0] = in_stack_ffffffffffffff90;
        }
      }
    }
    else if (xVar2 - node_pcdata < 4) {
      xml_node::value(&local_28);
      xpath_string::from_const
                ((char_t *)
                 CONCAT44(xVar2,CONCAT13(in_stack_ffffffffffffff53,
                                         CONCAT12(in_stack_ffffffffffffff52,
                                                  in_stack_ffffffffffffff50))));
    }
    else {
      xpath_string::xpath_string(in_RDI);
    }
  }
  else {
    local_20 = xpath_node::attribute(local_8);
    xml_attribute::value(&local_20);
    xpath_string::from_const
              ((char_t *)
               CONCAT44(in_stack_ffffffffffffff54,
                        CONCAT13(in_stack_ffffffffffffff53,
                                 CONCAT12(in_stack_ffffffffffffff52,in_stack_ffffffffffffff50))));
  }
  return in_RDI;
}

Assistant:

PUGI_IMPL_FN xpath_string string_value(const xpath_node& na, xpath_allocator* alloc)
	{
		if (na.attribute())
			return xpath_string::from_const(na.attribute().value());
		else
		{
			xml_node n = na.node();

			switch (n.type())
			{
			case node_pcdata:
			case node_cdata:
			case node_comment:
			case node_pi:
				return xpath_string::from_const(n.value());

			case node_document:
			case node_element:
			{
				xpath_string result;

				// element nodes can have value if parse_embed_pcdata was used
				if (n.value()[0])
					result.append(xpath_string::from_const(n.value()), alloc);

				xml_node cur = n.first_child();

				while (cur && cur != n)
				{
					if (cur.type() == node_pcdata || cur.type() == node_cdata)
						result.append(xpath_string::from_const(cur.value()), alloc);

					if (cur.first_child())
						cur = cur.first_child();
					else if (cur.next_sibling())
						cur = cur.next_sibling();
					else
					{
						while (!cur.next_sibling() && cur != n)
							cur = cur.parent();

						if (cur != n) cur = cur.next_sibling();
					}
				}

				return result;
			}

			default:
				return xpath_string();
			}
		}
	}